

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve64_CP32_SHA512.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint32_t i;
  uint ikmlen;
  long lVar13;
  uint8_t *puVar14;
  byte bVar15;
  undefined8 uStack_400;
  uint8_t auStack_3f8 [6];
  undefined2 uStack_3f2;
  uint8_t auStack_3f0 [9];
  uint8_t auStack_3e7 [10];
  undefined2 uStack_3dd;
  uint8_t auStack_3db [9];
  uint8_t auStack_3d2 [8];
  uint8_t auStack_3ca [8];
  uint8_t auStack_3c2 [8];
  uint8_t auStack_3ba [8];
  undefined8 auStack_3b2 [10];
  uint8_t auStack_360 [8];
  uint8_t auStack_358 [6];
  undefined2 uStack_352;
  uint8_t auStack_350 [9];
  uint8_t auStack_347 [6];
  undefined8 uStack_341;
  uint8_t auStack_339 [8];
  uint8_t auStack_331 [8];
  uint8_t auStack_329 [8];
  uint8_t auStack_321 [8];
  undefined8 auStack_319 [11];
  undefined8 uStack_2c0;
  uint8_t auStack_2b8 [6];
  undefined2 uStack_2b2;
  uint8_t auStack_2b0 [9];
  uint8_t auStack_2a7 [6];
  undefined8 uStack_2a1;
  uint8_t auStack_299 [8];
  uint8_t auStack_291 [8];
  uint8_t auStack_289 [8];
  uint8_t auStack_281 [8];
  undefined1 auStack_279 [8];
  undefined1 auStack_271 [8];
  undefined1 auStack_269 [8];
  undefined1 auStack_261 [8];
  undefined1 auStack_259 [8];
  undefined1 auStack_251 [8];
  undefined1 auStack_249 [8];
  undefined1 auStack_241 [8];
  undefined1 auStack_239 [8];
  undefined1 auStack_231 [8];
  undefined1 auStack_229 [9];
  undefined3 uStack_220;
  undefined5 uStack_21d;
  uint8_t local_218 [4];
  undefined2 uStack_214;
  undefined1 uStack_212;
  undefined1 auStack_211 [4];
  undefined4 uStack_20d;
  uint8_t auStack_209 [2];
  undefined1 auStack_207 [4];
  undefined2 uStack_203;
  undefined3 uStack_200;
  undefined5 uStack_1fd;
  uint8_t local_1f8 [3];
  undefined1 uStack_1f5;
  undefined2 uStack_1f4;
  uint8_t auStack_1f2 [9];
  undefined1 auStack_1e9 [9];
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  uint8_t suite_id_kem [5];
  undefined8 uStack_198;
  uint8_t o_eae_prk [32];
  uint8_t auStack_158 [8];
  uint8_t zeros [32];
  uint8_t auStack_118 [8];
  uint8_t o_shared [32];
  undefined8 local_e8;
  uint8_t suite_id [10];
  uint8_t o_dh [32];
  uint8_t o_kemcontext [64];
  uint local_34;
  
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  auStack_118[0] = '\0';
  auStack_118[1] = '\0';
  auStack_118[2] = '\0';
  auStack_118[3] = '\0';
  auStack_118[4] = '\0';
  auStack_118[5] = '\0';
  auStack_118[6] = '\0';
  auStack_118[7] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  uStack_1e0 = 0x185755;
  Hacl_Curve25519_64_secret_to_public(o_pkE,skE);
  stack0xffffffffffffff28 = 0;
  zeros[8] = '\0';
  zeros[9] = '\0';
  zeros[10] = '\0';
  zeros[0xb] = '\0';
  zeros[0xc] = '\0';
  zeros[0xd] = '\0';
  zeros[0xe] = '\0';
  zeros[0xf] = '\0';
  zeros[0x10] = '\0';
  zeros[0x11] = '\0';
  zeros[0x12] = '\0';
  zeros[0x13] = '\0';
  zeros[0x14] = '\0';
  zeros[0x15] = '\0';
  zeros[0x16] = '\0';
  zeros[0x17] = '\0';
  auStack_158[0] = '\0';
  auStack_158[1] = '\0';
  auStack_158[2] = '\0';
  auStack_158[3] = '\0';
  auStack_158[4] = '\0';
  auStack_158[5] = '\0';
  auStack_158[6] = '\0';
  auStack_158[7] = '\0';
  zeros[0] = '\0';
  zeros[1] = '\0';
  zeros[2] = '\0';
  zeros[3] = '\0';
  zeros[4] = '\0';
  zeros[5] = '\0';
  zeros[6] = '\0';
  zeros[7] = '\0';
  uStack_1e0 = 0x18577f;
  Hacl_Curve25519_64_scalarmult(suite_id + 8,skE,pkR);
  bVar15 = 0xff;
  lVar13 = 0;
  do {
    uStack_1e0 = 0x18579c;
    bVar9 = FStar_UInt8_eq_mask(suite_id[lVar13 + 8],zeros[lVar13 + -8]);
    bVar15 = bVar15 & bVar9;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x20);
  if (bVar15 != 0xff) {
    uVar1 = *(undefined8 *)o_pkE;
    uVar2 = *(undefined8 *)(o_pkE + 8);
    uVar3 = *(undefined8 *)(o_pkE + 0x10);
    uVar4 = *(undefined8 *)(o_pkE + 0x18);
    uVar5 = *(undefined8 *)pkR;
    uVar6 = *(undefined8 *)(pkR + 8);
    uVar7 = *(undefined8 *)(pkR + 0x10);
    uVar8 = *(undefined8 *)(pkR + 0x18);
    o_eae_prk[8] = '\0';
    o_eae_prk[9] = '\0';
    o_eae_prk[10] = '\0';
    o_eae_prk[0xb] = '\0';
    o_eae_prk[0xc] = '\0';
    o_eae_prk[0xd] = '\0';
    o_eae_prk[0xe] = '\0';
    o_eae_prk[0xf] = '\0';
    o_eae_prk[0x10] = '\0';
    o_eae_prk[0x11] = '\0';
    o_eae_prk[0x12] = '\0';
    o_eae_prk[0x13] = '\0';
    o_eae_prk[0x14] = '\0';
    o_eae_prk[0x15] = '\0';
    o_eae_prk[0x16] = '\0';
    o_eae_prk[0x17] = '\0';
    uStack_198 = 0;
    o_eae_prk[0] = '\0';
    o_eae_prk[1] = '\0';
    o_eae_prk[2] = '\0';
    o_eae_prk[3] = '\0';
    o_eae_prk[4] = '\0';
    o_eae_prk[5] = '\0';
    o_eae_prk[6] = '\0';
    o_eae_prk[7] = '\0';
    uStack_1d8 = CONCAT35(uStack_1d8._5_3_,0x20004d454b);
    builtin_memcpy(local_218,"HPKE",4);
    uStack_214 = 0x762d;
    uStack_212 = 0x31;
    auStack_211 = (undefined1  [4])0x4d454b;
    uStack_20d = 0x65616520;
    _auStack_209 = 0x6b72705f;
    stack0xfffffffffffffdfb = (undefined5)stack0xffffffffffffff28;
    uStack_200 = (undefined3)((ulong)stack0xffffffffffffff28 >> 0x28);
    uStack_1fd = 0;
    local_1f8[0] = '\0';
    local_1f8[1] = '\0';
    local_1f8[2] = '\0';
    _uStack_1f5 = 0;
    auStack_1f2[2] = '\0';
    auStack_1f2[3] = '\0';
    auStack_1f2[4] = '\0';
    auStack_1f2[5] = '\0';
    auStack_1f2[6] = '\0';
    auStack_1f2[7] = '\0';
    auStack_1f2[8] = '\0';
    auStack_1e9._0_4_ = 0;
    uStack_220 = 0x18588b;
    uStack_21d = 0;
    Hacl_HKDF_extract_sha2_256((uint8_t *)&uStack_198,(uint8_t *)&uStack_1d8,0,local_218,0x33);
    stack0xfffffffffffffd88 = 0x762d454b50482000;
    auStack_271[1] = 0x31;
    auStack_271._2_4_ = (undefined4)uStack_1d8;
    auStack_271[6] = uStack_1d8._4_1_;
    stack0xfffffffffffffd96 = 0x6873;
    auStack_269._1_3_ = 0x657261;
    auStack_269._4_3_ = 0x735f64;
    stack0xfffffffffffffd9e = 0x6365;
    auStack_261._1_3_ = 0x746572;
    stack0xfffffffffffffda3 = (undefined5)uVar1;
    auStack_259._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
    stack0xfffffffffffffdab = (undefined5)uVar2;
    auStack_251._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    stack0xfffffffffffffdb3 = (undefined5)uVar3;
    auStack_249._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    stack0xfffffffffffffdbb = (undefined5)uVar4;
    auStack_241._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    stack0xfffffffffffffdc3 = (undefined5)uVar5;
    auStack_239._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    stack0xfffffffffffffdcb = (undefined5)uVar6;
    auStack_231._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    stack0xfffffffffffffdd3 = (undefined5)uVar7;
    auStack_229._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    auStack_229._4_5_ = (undefined5)uVar8;
    uStack_220 = (undefined3)((ulong)uVar8 >> 0x28);
    Hacl_HKDF_expand_sha2_256(auStack_118,(uint8_t *)&uStack_198,0x20,auStack_279 + 1,0x5b,0x20);
    zeros[0x18] = '\0';
    zeros[0x19] = '\0';
    zeros[0x1a] = '\0';
    zeros[0x1b] = '\0';
    zeros[0x1c] = '\0';
    zeros[0x1d] = '\0';
    zeros[0x1e] = '\0';
    zeros[0x1f] = '\0';
    zeros[8] = '\0';
    zeros[9] = '\0';
    zeros[10] = '\0';
    zeros[0xb] = '\0';
    zeros[0xc] = '\0';
    zeros[0xd] = '\0';
    zeros[0xe] = '\0';
    zeros[0xf] = '\0';
    zeros[0x10] = '\0';
    zeros[0x11] = '\0';
    zeros[0x12] = '\0';
    zeros[0x13] = '\0';
    zeros[0x14] = '\0';
    zeros[0x15] = '\0';
    zeros[0x16] = '\0';
    zeros[0x17] = '\0';
    auStack_158[0] = '\0';
    auStack_158[1] = '\0';
    auStack_158[2] = '\0';
    auStack_158[3] = '\0';
    auStack_158[4] = '\0';
    auStack_158[5] = '\0';
    auStack_158[6] = '\0';
    auStack_158[7] = '\0';
    zeros[0] = '\0';
    zeros[1] = '\0';
    zeros[2] = '\0';
    zeros[3] = '\0';
    zeros[4] = '\0';
    zeros[5] = '\0';
    zeros[6] = '\0';
    zeros[7] = '\0';
    local_e8 = 0x3002000454b5048;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    o_eae_prk[0x18] = '\0';
    o_eae_prk[0x19] = '\0';
    o_eae_prk[0x1a] = '\0';
    o_eae_prk[0x1b] = '\0';
    o_eae_prk[0x1c] = '\0';
    o_eae_prk[0x1d] = '\0';
    o_eae_prk[0x1e] = '\0';
    o_eae_prk[0x1f] = '\0';
    o_eae_prk[8] = '\0';
    o_eae_prk[9] = '\0';
    o_eae_prk[10] = '\0';
    o_eae_prk[0xb] = '\0';
    o_eae_prk[0xc] = '\0';
    o_eae_prk[0xd] = '\0';
    o_eae_prk[0xe] = '\0';
    o_eae_prk[0xf] = '\0';
    o_eae_prk[0x10] = '\0';
    o_eae_prk[0x11] = '\0';
    o_eae_prk[0x12] = '\0';
    o_eae_prk[0x13] = '\0';
    o_eae_prk[0x14] = '\0';
    o_eae_prk[0x15] = '\0';
    o_eae_prk[0x16] = '\0';
    o_eae_prk[0x17] = '\0';
    uStack_198 = 0;
    o_eae_prk[0] = '\0';
    o_eae_prk[1] = '\0';
    o_eae_prk[2] = '\0';
    o_eae_prk[3] = '\0';
    o_eae_prk[4] = '\0';
    o_eae_prk[5] = '\0';
    o_eae_prk[6] = '\0';
    o_eae_prk[7] = '\0';
    _local_1f8 = 0x454b5048;
    local_1f8[0] = 'H';
    local_1f8[1] = 'P';
    local_1f8[2] = 'K';
    uStack_1f4 = 0x762d;
    auStack_1f2[0] = 0x31;
    uStack_1e0._0_4_ = 0x68736168;
    uStack_1fd = 0;
    uStack_200 = 0x1859f2;
    Hacl_HKDF_extract_sha2_512((uint8_t *)&uStack_198,(uint8_t *)&local_e8,0,local_1f8,0x1c);
    uStack_1d8 = 0;
    _suite_id_kem = 0;
    ikmlen = infolen + 0x1a;
    uVar10 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    lVar13 = -uVar10;
    puVar14 = local_1f8 + lVar13;
    *(undefined8 *)((long)&uStack_200 + lVar13) = 0x185a3c;
    memset(puVar14,0,(ulong)ikmlen);
    puVar14[0] = 'H';
    puVar14[1] = 'P';
    puVar14[2] = 'K';
    puVar14[3] = 'E';
    (local_1f8 + lVar13 + 4)[0] = '-';
    (local_1f8 + lVar13 + 4)[1] = 'v';
    local_1f8[lVar13 + 6] = '1';
    *(undefined8 *)(local_1f8 + lVar13 + 7) = local_e8;
    *(undefined2 *)(auStack_1e9 + lVar13) = suite_id._0_2_;
    *(undefined8 *)(auStack_1e9 + lVar13 + 2) = 0x7361685f6f666e69;
    *(undefined1 *)((long)&uStack_1e0 + (1 - uVar10)) = 0x68;
    *(undefined8 *)((long)&uStack_200 + lVar13) = 0x185a97;
    memcpy((void *)((long)&uStack_1e0 + lVar13 + 2),info,(ulong)infolen);
    *(undefined8 *)((long)&uStack_200 + lVar13) = 0x185ab1;
    Hacl_HKDF_extract_sha2_512((uint8_t *)&uStack_1d8,(uint8_t *)&local_e8,0,puVar14,ikmlen);
    uVar6 = o_eae_prk._24_8_;
    uVar5 = o_eae_prk._16_8_;
    uVar4 = o_eae_prk._8_8_;
    uVar3 = o_eae_prk._0_8_;
    uVar2 = uStack_198;
    uVar1 = _suite_id_kem;
    stack0xffffffffffffff28 = uStack_1d8;
    puVar14 = local_218 + lVar13;
    puVar14[0] = '\0';
    puVar14[1] = '\0';
    puVar14[2] = '\0';
    puVar14[3] = '\0';
    puVar14[4] = '\0';
    puVar14[5] = '\0';
    puVar14[6] = '\0';
    puVar14[7] = '\0';
    *(undefined8 *)(auStack_211 + lVar13 + 1) = 0;
    puVar14 = auStack_209 + lVar13;
    puVar14[0] = '\0';
    puVar14[1] = '\0';
    puVar14[2] = '\0';
    puVar14[3] = '\0';
    puVar14[4] = '\0';
    puVar14[5] = '\0';
    puVar14[6] = '\0';
    puVar14[7] = '\0';
    builtin_memcpy(local_218 + lVar13,"HPKE",4);
    *(undefined2 *)((long)&uStack_214 + lVar13) = 0x762d;
    (&uStack_212)[lVar13] = 0x31;
    *(undefined8 *)(auStack_211 + lVar13) = local_e8;
    *(undefined2 *)(auStack_209 + lVar13) = suite_id._0_2_;
    *(undefined4 *)(auStack_207 + lVar13) = 0x72636573;
    *(undefined2 *)((long)&uStack_203 + lVar13) = 0x7465;
    *(undefined8 *)((long)&uStack_220 + lVar13) = 0x185b73;
    Hacl_HKDF_extract_sha2_512(auStack_158,auStack_118,0x20,local_218 + lVar13,0x17);
    *(undefined8 *)((long)&uStack_2c0 + lVar13) = 0x185b8f;
    memset(auStack_2b8 + lVar13,0,0x97);
    (auStack_2b8 + lVar13)[0] = '\0';
    (auStack_2b8 + lVar13)[1] = '@';
    puVar14 = auStack_2b8 + lVar13 + 2;
    puVar14[0] = 'H';
    puVar14[1] = 'P';
    puVar14[2] = 'K';
    puVar14[3] = 'E';
    *(undefined2 *)((long)&uStack_2b2 + lVar13) = 0x762d;
    auStack_2b0[lVar13] = '1';
    *(undefined8 *)(auStack_2a7 + lVar13 + -8) = local_e8;
    *(undefined2 *)(auStack_2a7 + lVar13) = suite_id._0_2_;
    puVar14 = auStack_2a7 + lVar13 + 2;
    puVar14[0] = 'e';
    puVar14[1] = 'x';
    puVar14[2] = 'p';
    puVar14[3] = '\0';
    *(undefined8 *)(auStack_271 + lVar13) = 0;
    *(undefined8 *)(auStack_269 + lVar13) = 0;
    *(undefined8 *)(auStack_281 + lVar13) = uVar6;
    *(undefined8 *)(auStack_279 + lVar13) = 0;
    *(undefined8 *)(auStack_291 + lVar13) = uVar4;
    *(undefined8 *)(auStack_289 + lVar13) = uVar5;
    *(undefined8 *)((long)&uStack_2a1 + lVar13) = uVar2;
    *(undefined8 *)(auStack_299 + lVar13) = uVar3;
    *(undefined8 *)(auStack_261 + lVar13) = stack0xffffffffffffff28;
    *(undefined8 *)(auStack_259 + lVar13) = uVar1;
    *(undefined8 *)(auStack_251 + lVar13) = 0;
    *(undefined8 *)(auStack_249 + lVar13) = 0;
    *(undefined8 *)(auStack_231 + lVar13) = 0;
    *(undefined8 *)(auStack_229 + lVar13) = 0;
    *(undefined8 *)(auStack_241 + lVar13) = 0;
    *(undefined8 *)(auStack_239 + lVar13) = 0;
    *(undefined8 *)((long)&uStack_2c0 + lVar13) = 0x185c53;
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter,auStack_158,0x40,auStack_2b8 + lVar13,0x97,0x40);
    puVar11 = auStack_358 + lVar13 + -8;
    builtin_memcpy(auStack_358 + lVar13 + -8,"o\\\x18",4);
    puVar11[4] = '\0';
    puVar11[5] = '\0';
    puVar11[6] = '\0';
    puVar11[7] = '\0';
    memset(auStack_358 + lVar13,0,0x97);
    (auStack_358 + lVar13)[0] = '\0';
    (auStack_358 + lVar13)[1] = ' ';
    puVar14 = auStack_358 + lVar13 + 2;
    puVar14[0] = 'H';
    puVar14[1] = 'P';
    puVar14[2] = 'K';
    puVar14[3] = 'E';
    *(undefined2 *)((long)&uStack_352 + lVar13) = 0x762d;
    auStack_350[lVar13] = '1';
    *(undefined8 *)(auStack_347 + lVar13 + -8) = local_e8;
    *(undefined2 *)(auStack_347 + lVar13) = suite_id._0_2_;
    puVar14 = auStack_347 + lVar13 + 2;
    puVar14[0] = 'k';
    puVar14[1] = 'e';
    puVar14[2] = 'y';
    puVar14[3] = '\0';
    *(undefined8 *)((long)auStack_319 + lVar13 + 8) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x10) = 0;
    *(undefined8 *)(auStack_321 + lVar13) = uVar6;
    *(undefined8 *)((long)auStack_319 + lVar13) = 0;
    *(undefined8 *)(auStack_331 + lVar13) = uVar4;
    *(undefined8 *)(auStack_329 + lVar13) = uVar5;
    *(undefined8 *)((long)&uStack_341 + lVar13) = uVar2;
    *(undefined8 *)(auStack_339 + lVar13) = uVar3;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x18) = stack0xffffffffffffff28;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x20) = uVar1;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x28) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x30) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x48) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x50) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x38) = 0;
    *(undefined8 *)((long)auStack_319 + lVar13 + 0x40) = 0;
    puVar12 = auStack_358 + lVar13 + -8;
    builtin_memcpy(auStack_358 + lVar13 + -8,"8]\x18",4);
    puVar12[4] = '\0';
    puVar12[5] = '\0';
    puVar12[6] = '\0';
    puVar12[7] = '\0';
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key,auStack_158,0x40,auStack_358 + lVar13,0x97,0x20);
    *(undefined8 *)((long)&uStack_400 + lVar13) = 0x185d54;
    memset(auStack_3f8 + lVar13,0,0x9e);
    (auStack_3f8 + lVar13)[0] = '\0';
    (auStack_3f8 + lVar13)[1] = '\f';
    puVar14 = auStack_3f8 + lVar13 + 2;
    puVar14[0] = 'H';
    puVar14[1] = 'P';
    puVar14[2] = 'K';
    puVar14[3] = 'E';
    *(undefined2 *)((long)&uStack_3f2 + lVar13) = 0x762d;
    auStack_3f0[lVar13] = '1';
    *(undefined8 *)(auStack_3e7 + lVar13 + -8) = local_e8;
    *(undefined2 *)(auStack_3e7 + lVar13) = suite_id._0_2_;
    puVar14 = auStack_3e7 + lVar13 + 2;
    puVar14[0] = 'b';
    puVar14[1] = 'a';
    puVar14[2] = 's';
    puVar14[3] = 'e';
    puVar14[4] = '_';
    puVar14[5] = 'n';
    puVar14[6] = 'o';
    puVar14[7] = 'n';
    *(undefined2 *)((long)&uStack_3dd + lVar13) = 0x6563;
    auStack_3db[lVar13] = '\0';
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 8) = 0;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x10) = 0;
    *(undefined8 *)(auStack_3ba + lVar13) = uVar6;
    *(undefined8 *)((long)auStack_3b2 + lVar13) = 0;
    *(undefined8 *)(auStack_3ca + lVar13) = uVar4;
    *(undefined8 *)(auStack_3c2 + lVar13) = uVar5;
    *(undefined8 *)(auStack_3d2 + lVar13 + -8) = uVar2;
    *(undefined8 *)(auStack_3d2 + lVar13) = uVar3;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x18) = stack0xffffffffffffff28;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x20) = uVar1;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x28) = 0;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x30) = 0;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x48) = 0;
    *(undefined8 *)(&stack0xfffffffffffffc9e + lVar13) = 0;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x38) = 0;
    *(undefined8 *)((long)auStack_3b2 + lVar13 + 0x40) = 0;
    *(undefined8 *)((long)&uStack_400 + lVar13) = 0x185e30;
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce,auStack_158,0x40,auStack_3f8 + lVar13,0x9e,0xc);
    *o_ctx.ctx_seq = 0;
  }
  local_34 = (uint)(bVar15 == 0xff);
  return local_34;
}

Assistant:

uint32_t
Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_64_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_64_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[129U] = { 0U };
    uint8_t o_secret[64U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 3U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[64U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[64U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 64U * sizeof (uint8_t));
    memcpy(o_context + 65U, o_info_hash, 64U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)64U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter, o_secret, 64U, tmp3, len3, 64U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key, o_secret, 64U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 158U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce, o_secret, 64U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}